

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O1

Emb_Obj_t * Emb_ManPerformBfs(Emb_Man_t *p,Vec_Int_t *vThis,Vec_Int_t *vNext,Emb_Dat_t *pDist)

{
  uint *puVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  Vec_Int_t *p_00;
  ulong uVar7;
  long lVar8;
  float fVar9;
  int *local_40;
  
  if (vThis->nSize < 1) {
    __assert_fail("Vec_IntSize(vThis) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x3a7,
                  "Emb_Obj_t *Emb_ManPerformBfs(Emb_Man_t *, Vec_Int_t *, Vec_Int_t *, Emb_Dat_t *)"
                 );
  }
  p->nDistMax = 0;
  iVar4 = vThis->nSize;
  if (iVar4 < 1) {
    fVar9 = -1.0;
  }
  else {
    local_40 = &vThis->nSize;
    pVVar3 = vNext;
    p_00 = vThis;
    do {
      vNext = p_00;
      p_00 = pVVar3;
      p->nReached = p->nReached + iVar4;
      p_00->nSize = 0;
      if (0 < vNext->nSize) {
        lVar8 = 0;
        do {
          if (p->pObjData == (int *)0x0) break;
          puVar1 = (uint *)(p->pObjData + (uint)vNext->pArray[lVar8]);
          if (pDist != (Emb_Dat_t *)0x0) {
            pDist[puVar1[4]] = (float)p->nDistMax;
          }
          if (0xf < *puVar1) {
            uVar7 = 0;
            do {
              lVar5 = (long)(int)puVar1[uVar7 + 5];
              if (puVar1[3 - lVar5] != p->nTravIds) {
                puVar1[3 - lVar5] = p->nTravIds;
                Vec_IntPush(p_00,puVar1[2 - lVar5]);
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 < *puVar1 >> 4);
          }
          if (0 < (int)puVar1[1]) {
            lVar5 = 0;
            do {
              lVar6 = (long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar5 + 5];
              if (puVar1[lVar6 + 3] != p->nTravIds) {
                puVar1[lVar6 + 3] = p->nTravIds;
                Vec_IntPush(p_00,puVar1[lVar6 + 2]);
              }
              lVar5 = lVar5 + 1;
            } while ((int)lVar5 < (int)puVar1[1]);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < *local_40);
      }
      iVar2 = p->nDistMax;
      p->nDistMax = iVar2 + 1;
      local_40 = &p_00->nSize;
      iVar4 = p_00->nSize;
      pVVar3 = vNext;
    } while (0 < iVar4);
    fVar9 = (float)iVar2;
  }
  if (vNext->nSize < 1) {
    __assert_fail("Vec_IntSize(vNext) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x3c0,
                  "Emb_Obj_t *Emb_ManPerformBfs(Emb_Man_t *, Vec_Int_t *, Vec_Int_t *, Emb_Dat_t *)"
                 );
  }
  if ((pDist != (Emb_Dat_t *)0x0) &&
     ((pDist[(((Emb_Obj_t *)(p->pObjData + (uint)*vNext->pArray))->field_8).Value] != fVar9 ||
      (NAN(pDist[(((Emb_Obj_t *)(p->pObjData + (uint)*vNext->pArray))->field_8).Value]) ||
       NAN(fVar9))))) {
    __assert_fail("pDist == NULL || pDist[pResult->Value] == p->nDistMax - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x3c2,
                  "Emb_Obj_t *Emb_ManPerformBfs(Emb_Man_t *, Vec_Int_t *, Vec_Int_t *, Emb_Dat_t *)"
                 );
  }
  return (Emb_Obj_t *)(p->pObjData + (uint)*vNext->pArray);
}

Assistant:

Emb_Obj_t * Emb_ManPerformBfs( Emb_Man_t * p, Vec_Int_t * vThis, Vec_Int_t * vNext, Emb_Dat_t * pDist )
{
    Vec_Int_t * vTemp;
    Emb_Obj_t * pThis, * pNext, * pResult;
    int i, k;
    assert( Vec_IntSize(vThis) > 0 );
    for ( p->nDistMax = 0; Vec_IntSize(vThis) > 0; p->nDistMax++ )
    {
        p->nReached += Vec_IntSize(vThis);
        Vec_IntClear( vNext );
        Emb_ManForEachObjVec( vThis, p, pThis, i )
        {
            if ( pDist ) pDist[pThis->Value] = p->nDistMax;
            Emb_ObjForEachFanin( pThis, pNext, k )
            {
                if ( Emb_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                Emb_ObjSetTravIdCurrent(p, pNext);
                Vec_IntPush( vNext, pNext->hHandle );
            }
            Emb_ObjForEachFanout( pThis, pNext, k )
            {
                if ( Emb_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                Emb_ObjSetTravIdCurrent(p, pNext);
                Vec_IntPush( vNext, pNext->hHandle );
            }
        }
        vTemp = vThis; vThis = vNext; vNext = vTemp;
    }
    assert( Vec_IntSize(vNext) > 0 );
    pResult = Emb_ManObj( p, Vec_IntEntry(vNext, 0) );
    assert( pDist == NULL || pDist[pResult->Value] == p->nDistMax - 1 );
    return pResult;
}